

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void * env_tilde_new(t_floatarg fnpoints,t_floatarg fperiod)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  _binbuf *p_Var4;
  t_object *owner;
  _clock *p_Var5;
  t_symbol *s;
  t_pd p_Var6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar11 = 0x400;
  if (0 < (int)fnpoints) {
    uVar11 = (int)fnpoints;
  }
  p_Var4 = (_binbuf *)getbytes((long)(int)uVar11 * 4 + 0x100);
  if (p_Var4 == (_binbuf *)0x0) {
    owner = (t_object *)0x0;
    pd_error((void *)0x0,"env: couldn\'t allocate buffer");
  }
  else {
    iVar2 = (int)uVar11 / 2;
    if (0 < (int)fperiod) {
      iVar2 = (int)fperiod;
    }
    uVar3 = uVar11 + 0x1f;
    if (-1 < (int)uVar11) {
      uVar3 = uVar11;
    }
    iVar7 = ((int)uVar3 >> 5) + 1;
    if ((int)uVar3 >> 5 < iVar2) {
      iVar7 = iVar2;
    }
    owner = (t_object *)pd_new(env_tilde_class);
    owner[1].te_binbuf = p_Var4;
    *(uint *)((long)&owner[1].te_inlet + 4) = uVar11;
    *(undefined4 *)&owner[1].te_outlet = 0;
    *(int *)((long)&owner[1].te_outlet + 4) = iVar7;
    *(undefined8 *)&owner[1].te_width = 0;
    *(undefined8 *)((long)&owner[2].te_g.g_pd + 4) = 0;
    *(undefined8 *)((long)&owner[2].te_g.g_next + 4) = 0;
    *(undefined8 *)((long)&owner[2].te_binbuf + 4) = 0;
    *(undefined8 *)((long)&owner[2].te_outlet + 4) = 0;
    *(undefined8 *)((long)&owner[2].te_inlet + 4) = 0;
    *(undefined8 *)&owner[2].te_width = 0;
    *(undefined8 *)((long)&owner[3].te_g.g_pd + 4) = 0;
    *(undefined8 *)((long)&owner[3].te_g.g_next + 4) = 0;
    *(undefined8 *)((long)&owner[3].te_binbuf + 4) = 0;
    *(undefined8 *)((long)&owner[3].te_outlet + 4) = 0;
    *(undefined8 *)((long)&owner[3].te_inlet + 4) = 0;
    *(undefined8 *)&owner[3].te_width = 0;
    *(undefined8 *)((long)&owner[4].te_g.g_pd + 4) = 0;
    uVar10 = 1;
    if (1 < (int)uVar11) {
      uVar10 = (ulong)uVar11;
    }
    *(undefined8 *)((long)&owner[4].te_g.g_next + 4) = 0;
    *(undefined8 *)((long)&owner[4].te_binbuf + 4) = 0;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      dVar1 = cos(((double)(int)uVar8 * 6.28318) / (double)(int)uVar11);
      (&p_Var4->b_n)[uVar8] = (int)(float)((1.0 - dVar1) / (double)(int)uVar11);
      uVar9 = uVar8 + 1;
    } while (uVar10 != uVar9);
    if ((int)uVar9 < (int)(uVar11 + 0x40)) {
      memset(&p_Var4->field_0x4 + uVar8 * 4,0,(ulong)((uVar11 - (int)uVar9) + 0x3f) * 4 + 4);
    }
    p_Var5 = clock_new(owner,env_tilde_tick);
    owner[1].te_g.g_next = (_gobj *)p_Var5;
    s = gensym("float");
    p_Var6 = (t_pd)outlet_new(owner,s);
    owner[1].te_g.g_pd = p_Var6;
    *(undefined8 *)((long)&owner[4].te_outlet + 4) = 0x4000000000;
  }
  return owner;
}

Assistant:

static void *env_tilde_new(t_floatarg fnpoints, t_floatarg fperiod)
{
    int npoints = fnpoints;
    int period = fperiod;
    t_sigenv *x;
    t_sample *buf;
    int i;

    if (npoints < 1) npoints = 1024;
    if (period < 1) period = npoints/2;
    if (period < npoints / MAXOVERLAP + 1)
        period = npoints / MAXOVERLAP + 1;
    if (!(buf = getbytes(sizeof(t_sample) * (npoints + INITVSTAKEN))))
    {
        pd_error(0, "env: couldn't allocate buffer");
        return (0);
    }
    x = (t_sigenv *)pd_new(env_tilde_class);
    x->x_buf = buf;
    x->x_npoints = npoints;
    x->x_phase = 0;
    x->x_period = period;
    for (i = 0; i < MAXOVERLAP; i++) x->x_sumbuf[i] = 0;
    for (i = 0; i < npoints; i++)
        buf[i] = (1. - cos((2 * 3.14159 * i) / npoints))/npoints;
    for (; i < npoints+INITVSTAKEN; i++) buf[i] = 0;
    x->x_clock = clock_new(x, (t_method)env_tilde_tick);
    x->x_outlet = outlet_new(&x->x_obj, gensym("float"));
    x->x_f = 0;
    x->x_allocforvs = INITVSTAKEN;
    return (x);
}